

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O2

void __thiscall HdmiCecAnalyzerResults::GenEOMBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  long lVar1;
  char *pcVar2;
  allocator local_51;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  lVar1 = *(long *)(frame + 0x10);
  if (this->mTabular == false) {
    std::__cxx11::string::string((string *)&local_50,"E",(allocator *)&local_30);
    AddResult(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar2 = "E=1";
    if (lVar1 == 0) {
      pcVar2 = "E=0";
    }
    std::__cxx11::string::string((string *)&local_50,pcVar2,(allocator *)&local_30);
    AddResult(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar2 = "EOM=1";
    if (lVar1 == 0) {
      pcVar2 = "EOM=0";
    }
    std::__cxx11::string::string((string *)&local_50,pcVar2,(allocator *)&local_30);
    AddResult(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pcVar2 = "A=1";
  if (lVar1 == 0) {
    pcVar2 = "A=0";
  }
  std::__cxx11::string::string((string *)&local_30,pcVar2 + 2,&local_51);
  std::operator+(&local_50,"End of Message = ",&local_30);
  AddResult(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenEOMBubble( const Frame& frame )
{
    bool eom = frame.mData1;

    if( !mTabular )
    {
        AddResult( "E" );
        AddResult( eom ? "E=1" : "E=0" );
        AddResult( eom ? "EOM=1" : "EOM=0" );
    }
    AddResult( "End of Message = " + std::string( eom ? "1" : "0" ) );
}